

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

bool SparseKeyTest<160,Blob<128>>
               (hashfunc<Blob<128>_> hash,int setbits,bool inclusive,bool testColl,bool testDist,
               bool drawDiagram)

{
  bool bVar1;
  pfHash p_Var2;
  reference pvVar3;
  size_type sVar4;
  undefined4 in_ECX;
  uint in_EDX;
  char *pcVar5;
  uint in_ESI;
  undefined4 in_R8D;
  byte in_R9B;
  bool result;
  keytype k;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> hashes;
  bool in_stack_0000007b;
  bool in_stack_0000007c;
  bool in_stack_0000007d;
  bool in_stack_0000007e;
  bool in_stack_0000007f;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> *in_stack_00000080;
  undefined4 in_stack_ffffffffffffffb0;
  byte bVar6;
  undefined4 in_stack_ffffffffffffffb4;
  undefined1 inclusive_00;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  pfHash in_stack_ffffffffffffffc0;
  vector<Blob<128>,_std::allocator<Blob<128>_>_> local_28;
  byte local_10;
  byte local_f;
  byte local_e;
  byte local_d;
  hashfunc local_8 [8];
  
  local_d = (byte)in_EDX & 1;
  local_e = (byte)in_ECX & 1;
  local_f = (byte)in_R8D & 1;
  local_10 = in_R9B & 1;
  pcVar5 = "exactly";
  if ((in_EDX & 1) != 0) {
    pcVar5 = "up to";
  }
  printf("Keyset \'Sparse\' - %d-bit keys with %s %d bits set - ",0xa0,pcVar5,(ulong)in_ESI);
  std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::vector
            ((vector<Blob<128>,_std::allocator<Blob<128>_>_> *)0x15eac1);
  Blob<160>::Blob((Blob<160> *)&stack0xffffffffffffffc4);
  memset(&stack0xffffffffffffffc4,0,0x14);
  if ((local_d & 1) != 0) {
    std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::resize
              ((vector<Blob<128>,_std::allocator<Blob<128>_>_> *)
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),CONCAT44(in_ESI,in_EDX)
              );
    p_Var2 = hashfunc::operator_cast_to_function_pointer(local_8);
    pvVar3 = std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::operator[](&local_28,0);
    (*p_Var2)(&stack0xffffffffffffffc4,0x14,0,pvVar3);
  }
  inclusive_00 = (undefined1)((uint)in_stack_ffffffffffffffb4 >> 0x18);
  hashfunc::operator_cast_to_function_pointer(local_8);
  SparseKeygenRecurse<Blob<160>,Blob<128>>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
             (bool)inclusive_00,(Blob<160> *)CONCAT44(in_ESI,in_EDX),
             (vector<Blob<128>,_std::allocator<Blob<128>_>_> *)CONCAT44(in_ECX,in_R8D));
  sVar4 = std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::size(&local_28);
  printf("%d keys\n",sVar4 & 0xffffffff);
  bVar6 = 1;
  bVar1 = TestHashList<Blob<128>>
                    (in_stack_00000080,in_stack_0000007f,in_stack_0000007e,in_stack_0000007d,
                     in_stack_0000007c,in_stack_0000007b);
  bVar6 = bVar1 & bVar6;
  printf("\n");
  std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::~vector
            ((vector<Blob<128>,_std::allocator<Blob<128>_>_> *)CONCAT44(in_ECX,in_R8D));
  return (bool)(bVar6 & 1);
}

Assistant:

bool SparseKeyTest ( hashfunc<hashtype> hash, const int setbits, bool inclusive,
                     bool testColl, bool testDist, bool drawDiagram )
{
  printf("Keyset 'Sparse' - %d-bit keys with %s %d bits set - ",keybits,
         inclusive ? "up to" : "exactly", setbits);

  typedef Blob<keybits> keytype;

  std::vector<hashtype> hashes;

  keytype k;
  memset(&k,0,sizeof(k));

  if(inclusive)
  {
    hashes.resize(1);
    hash(&k,sizeof(keytype),0,&hashes[0]);
  }

  SparseKeygenRecurse(hash,0,setbits,inclusive,k,hashes);

  printf("%d keys\n",(int)hashes.size());

  bool result = true;

  result &= TestHashList<hashtype>(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}